

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void lowbd_write_buffer_4xn_sse2(__m128i *in,uint8_t *output,int stride,int flipud,int height)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  ulong uVar6;
  __m128i *palVar7;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  iVar8 = height + -1;
  if (flipud == 0) {
    iVar8 = 0;
  }
  uVar6 = 0;
  if (0 < height) {
    uVar6 = (ulong)(uint)height;
  }
  palVar7 = in + iVar8;
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    uVar1 = *(undefined4 *)output;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint
                                                  )uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                         CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1)) >> 0x10),
                         (short)uVar1) & 0xffff00ff00ff00ff;
    auVar10 = paddsw(auVar10,(undefined1  [16])*palVar7);
    sVar2 = auVar10._0_2_;
    sVar3 = auVar10._2_2_;
    sVar4 = auVar10._4_2_;
    sVar5 = auVar10._6_2_;
    *(uint *)output =
         CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar10[6] - (0xff < sVar5),
                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar10[4] - (0xff < sVar4),
                           CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar10[2] - (0xff < sVar3),
                                    (0 < sVar2) * (sVar2 < 0x100) * auVar10[0] - (0xff < sVar2))));
    palVar7 = palVar7 + (ulong)(flipud == 0) * 2 + -1;
    output = output + stride;
  }
  return;
}

Assistant:

static inline void lowbd_write_buffer_4xn_sse2(__m128i *in, uint8_t *output,
                                               int stride, int flipud,
                                               const int height) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  const __m128i zero = _mm_setzero_si128();
  for (int i = 0; i < height; ++i, j += step) {
    const __m128i v = _mm_cvtsi32_si128(*((int *)(output + i * stride)));
    __m128i u = _mm_adds_epi16(in[j], _mm_unpacklo_epi8(v, zero));
    u = _mm_packus_epi16(u, zero);
    *((int *)(output + i * stride)) = _mm_cvtsi128_si32(u);
  }
}